

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O1

void * CallbackThreadFunc(void *userData)

{
  PaUtilBufferProcessor *bp;
  PaUtilCpuLoadMeasurer *measurer;
  int iVar1;
  PaError PVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  int *__retval;
  pthread_t pVar6;
  PaError PVar7;
  char *pcVar8;
  ulong callbackStatusFlags;
  int xrun;
  int callbackResult;
  unsigned_long framesAvail;
  PaStreamCallbackTimeInfo timeInfo;
  __pthread_unwind_buf_t __cancel_buf;
  int local_e0;
  int local_dc;
  ulong local_d8;
  ulong local_d0;
  PaUtilBufferProcessor *local_c8;
  PaUnixThread *local_c0;
  PaStreamCallbackTimeInfo local_b8;
  __pthread_unwind_buf_t local_98;
  
  local_b8.inputBufferAdcTime = 0.0;
  local_b8.currentTime = 0.0;
  local_b8.outputBufferDacTime = 0.0;
  local_dc = 0;
  if (userData == (void *)0x0) {
    __assert_fail("stream",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                  ,0x1060,"void *CallbackThreadFunc(void *)");
  }
  if (*(int *)((long)userData + 0x220) != 0) {
    __assert_fail("!stream->primeBuffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                  ,0x1062,"void *CallbackThreadFunc(void *)");
  }
  iVar1 = __sigsetjmp(&local_98,0);
  if (iVar1 != 0) {
    OnExit(userData);
    __pthread_unwind_next(&local_98);
LAB_00112995:
    pcVar8 = 
    "Expression \'PaUnixThread_PrepareNotify( &stream->thread )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4226\n"
    ;
    goto LAB_001129a5;
  }
  __pthread_register_cancel(&local_98);
  pthread_testcancel();
  iVar1 = 0;
  pthread_setcancelstate(1,(int *)0x0);
  if (*(int *)((long)userData + 0x220) == 0) {
    paUtilErr_ = PaUnixThread_PrepareNotify((PaUnixThread *)((long)userData + 0x198));
    if (paUtilErr_ < 0) goto LAB_00112995;
    paUtilErr_ = AlsaStart((PaAlsaStream *)userData,iVar1);
    if (paUtilErr_ < 0) {
      pcVar8 = 
      "Expression \'AlsaStart( stream, 0 )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4228\n"
      ;
LAB_001129a5:
      PaUtil_DebugPrint(pcVar8);
      PVar7 = paUtilErr_;
      goto LAB_00112912;
    }
    paUtilErr_ = PaUnixThread_NotifyParent((PaUnixThread *)((long)userData + 0x198));
    PVar7 = 0;
    if (paUtilErr_ < 0) {
      pcVar8 = 
      "Expression \'PaUnixThread_NotifyParent( &stream->thread )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4229\n"
      ;
      goto LAB_001129a5;
    }
  }
  else {
    PVar7 = 0;
    if (*(long *)((long)userData + 0x340) == 0) {
LAB_001125af:
      if ((*(long *)((long)userData + 0x2c0) != 0) && (*(int *)((long)userData + 0x228) == 0)) {
        iVar1 = snd_pcm_prepare();
        PVar2 = 0;
        if (iVar1 < 0) {
          pVar6 = pthread_self();
          iVar4 = pthread_equal(pVar6,paUnixMainThread);
          if (iVar4 != 0) {
            pcVar8 = (char *)snd_strerror(iVar1);
            PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar1,pcVar8);
          }
          PaUtil_DebugPrint(
                           "Expression \'alsa_snd_pcm_prepare( stream->capture.pcm )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4216\n"
                           );
          PVar7 = -9999;
          PVar2 = 8;
        }
        if (iVar1 < 0) goto LAB_0011262a;
      }
      uVar5 = snd_pcm_avail_update();
      PVar2 = 0;
      if (uVar5 - uVar5 % *(ulong *)((long)userData + 0x348) < *(ulong *)((long)userData + 0x348)) {
        __assert_fail("startThreshold >= stream->playback.framesPerPeriod",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                      ,0x107e,"void *CallbackThreadFunc(void *)");
      }
    }
    else {
      iVar1 = snd_pcm_prepare();
      PVar2 = 0;
      PVar7 = PVar2;
      if (iVar1 < 0) {
        pVar6 = pthread_self();
        iVar4 = pthread_equal(pVar6,paUnixMainThread);
        if (iVar4 != 0) {
          pcVar8 = (char *)snd_strerror(iVar1);
          PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar1,pcVar8);
        }
        PaUtil_DebugPrint(
                         "Expression \'alsa_snd_pcm_prepare( stream->playback.pcm )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4214\n"
                         );
        PVar7 = -9999;
        PVar2 = 8;
      }
      if (-1 < iVar1) goto LAB_001125af;
    }
LAB_0011262a:
    if (PVar2 != 0) goto LAB_00112912;
  }
  local_c0 = (PaUnixThread *)((long)userData + 0x198);
  bp = (PaUtilBufferProcessor *)((long)userData + 0x68);
  measurer = (PaUtilCpuLoadMeasurer *)((long)userData + 0x50);
  local_c8 = bp;
LAB_00112656:
  do {
    local_e0 = 0;
    pthread_testcancel();
    iVar1 = PaUnixThread_StopRequested(local_c0);
    if ((iVar1 != 0) && (local_dc == 0)) {
      local_dc = 1;
    }
    if ((local_dc == 0) ||
       ((*(uint *)((long)userData + 0x240) = (uint)(local_dc == 2),
        *(int *)((long)userData + 0x240) == 0 &&
        (iVar1 = PaUtil_IsBufferProcessorOutputEmpty(local_c8), iVar1 == 0)))) {
      paUtilErr_ = PaAlsaStream_WaitForFrames((PaAlsaStream *)userData,&local_d8,&local_e0);
      if (paUtilErr_ < 0) {
        pcVar8 = 
        "Expression \'PaAlsaStream_WaitForFrames( stream, &framesAvail, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4269\n"
        ;
LAB_001128dd:
        PaUtil_DebugPrint(pcVar8);
        uVar3 = 8;
        PVar7 = paUtilErr_;
      }
      else if (local_e0 == 0) {
        uVar3 = 0;
        if (local_d8 != 0) {
          while( true ) {
            local_e0 = 0;
            if (*(double *)((long)userData + 0x278) <= 0.0) {
              uVar5 = 0;
            }
            else {
              *(undefined8 *)((long)userData + 0x278) = 0;
              uVar5 = 4;
            }
            if (0.0 < *(double *)((long)userData + 0x280)) {
              uVar5 = uVar5 | 2;
              *(undefined8 *)((long)userData + 0x280) = 0;
            }
            callbackStatusFlags = uVar5;
            if ((*(long *)((long)userData + 0x2c0) != 0) && (*(long *)((long)userData + 0x340) != 0)
               ) {
              if (*(int *)((long)userData + 0x2e0) == 0) {
                callbackStatusFlags = uVar5 | 1;
              }
              else {
                callbackStatusFlags = uVar5 + 8;
                if (*(int *)((long)userData + 0x360) != 0) {
                  callbackStatusFlags = uVar5;
                }
              }
            }
            CalculateTimeInfo((PaAlsaStream *)userData,&local_b8);
            PaUtil_BeginBufferProcessing(bp,&local_b8,callbackStatusFlags);
            PaUtil_BeginCpuLoadMeasurement(measurer);
            local_d0 = local_d8;
            if (*(int *)((long)userData + 0x78) == 1) {
              local_d0 = *(ulong *)((long)userData + 0x218);
              if (local_d8 < *(ulong *)((long)userData + 0x218)) {
                local_d0 = local_d8;
              }
            }
            else {
              if (*(int *)((long)userData + 0x78) != 0) {
                __assert_fail("paUtilBoundedHostBufferSize == stream->bufferProcessor.hostBufferSizeMode"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                              ,0x10f0,"void *CallbackThreadFunc(void *)");
              }
              local_d0 = 0;
              if (*(ulong *)((long)userData + 0x218) <= local_d8) {
                local_d0 = *(ulong *)((long)userData + 0x218);
              }
            }
            paUtilErr_ = PaAlsaStream_SetUpBuffers((PaAlsaStream *)userData,&local_d0,&local_e0);
            uVar5 = local_d0;
            if (paUtilErr_ < 0) {
              pcVar8 = 
              "Expression \'PaAlsaStream_SetUpBuffers( stream, &framesGot, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4339\n"
              ;
              goto LAB_001128dd;
            }
            local_d8 = local_d8 - local_d0;
            if (local_d0 == 0) break;
            if (local_e0 != 0) {
              __assert_fail("!xrun",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                            ,0x10f9,"void *CallbackThreadFunc(void *)");
            }
            PaUtil_EndBufferProcessing(bp,&local_dc);
            paUtilErr_ = PaAlsaStream_EndProcessing((PaAlsaStream *)userData,uVar5,&local_e0);
            if (paUtilErr_ < 0) {
              pcVar8 = 
              "Expression \'PaAlsaStream_EndProcessing( stream, framesGot, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4347\n"
              ;
              goto LAB_001128dd;
            }
            PaUtil_EndCpuLoadMeasurement(measurer,uVar5);
            if (uVar5 == 0) goto LAB_0011289f;
            uVar3 = 0;
            if ((local_dc != 0) || (local_d8 == 0)) goto LAB_001128a1;
          }
          PaUtil_EndCpuLoadMeasurement(measurer,0);
LAB_0011289f:
          uVar3 = 0;
        }
      }
      else {
        uVar3 = 0x11;
        if (local_d8 != 0) {
          __assert_fail("0 == framesAvail",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                        ,0x10b0,"void *CallbackThreadFunc(void *)");
        }
      }
    }
    else {
      uVar3 = 0x13;
    }
LAB_001128a1:
    if (0x10 < uVar3) {
      if (uVar3 != 0x11) break;
      goto LAB_00112656;
    }
  } while (uVar3 == 0);
LAB_00112912:
  __pthread_unregister_cancel(&local_98);
  OnExit(userData);
  if (PVar7 != 0) {
    __retval = (int *)malloc(4);
    *__retval = PVar7;
    pthread_exit(__retval);
  }
  pthread_exit((void *)0x0);
}

Assistant:

static void *CallbackThreadFunc( void *userData )
{
    PaError result = paNoError;
    PaAlsaStream *stream = (PaAlsaStream*) userData;
    PaStreamCallbackTimeInfo timeInfo = {0, 0, 0};
    snd_pcm_sframes_t startThreshold = 0;
    int callbackResult = paContinue;
    PaStreamCallbackFlags cbFlags = 0;  /* We might want to keep state across iterations */
    int streamStarted = 0;

    assert( stream );
    /* Not implemented */
    assert( !stream->primeBuffers );

    /* Execute OnExit when exiting */
    pthread_cleanup_push( &OnExit, stream );
#ifdef PTHREAD_CANCELED
    /* 'Abort' will use thread cancellation to terminate the callback thread, but the Alsa-lib functions
     * are NOT cancel-safe, (and can end up in an inconsistent state).  So, disable cancelability for
     * the thread here, and just re-enable it for the poll() in PaAlsaStream_WaitForFrames(). */
    pthread_testcancel();
    pthread_setcancelstate( PTHREAD_CANCEL_DISABLE, NULL );
#endif

    /* @concern StreamStart If the output is being primed the output pcm needs to be prepared, otherwise the
     * stream is started immediately. The latter involves signaling the waiting main thread.
     */
    if( stream->primeBuffers )
    {
        snd_pcm_sframes_t avail;

        if( stream->playback.pcm )
            ENSURE_( alsa_snd_pcm_prepare( stream->playback.pcm ), paUnanticipatedHostError );
        if( stream->capture.pcm && !stream->pcmsSynced )
            ENSURE_( alsa_snd_pcm_prepare( stream->capture.pcm ), paUnanticipatedHostError );

        /* We can't be certain that the whole ring buffer is available for priming, but there should be
         * at least one period */
        avail = alsa_snd_pcm_avail_update( stream->playback.pcm );
        startThreshold = avail - (avail % stream->playback.framesPerPeriod);
        assert( startThreshold >= stream->playback.framesPerPeriod );
    }
    else
    {
        PA_ENSURE( PaUnixThread_PrepareNotify( &stream->thread ) );
        /* Buffer will be zeroed */
        PA_ENSURE( AlsaStart( stream, 0 ) );
        PA_ENSURE( PaUnixThread_NotifyParent( &stream->thread ) );

        streamStarted = 1;
    }

    while( 1 )
    {
        unsigned long framesAvail, framesGot;
        int xrun = 0;

#ifdef PTHREAD_CANCELED
        pthread_testcancel();
#endif

        /* @concern StreamStop if the main thread has requested a stop and the stream has not been effectively
         * stopped we signal this condition by modifying callbackResult (we'll want to flush buffered output).
         */
        if( PaUnixThread_StopRequested( &stream->thread ) && paContinue == callbackResult )
        {
            PA_DEBUG(( "Setting callbackResult to paComplete\n" ));
            callbackResult = paComplete;
        }

        if( paContinue != callbackResult )
        {
            stream->callbackAbort = ( paAbort == callbackResult );
            if( stream->callbackAbort ||
                    /** @concern BlockAdaption: Go on if adaption buffers are empty */
                    PaUtil_IsBufferProcessorOutputEmpty( &stream->bufferProcessor ) )
            {
                goto end;
            }

            PA_DEBUG(( "%s: Flushing buffer processor\n", __FUNCTION__ ));
            /* There is still buffered output that needs to be processed */
        }

        /* Wait for data to become available, this comes down to polling the ALSA file descriptors untill we have
         * a number of available frames.
         */
        PA_ENSURE( PaAlsaStream_WaitForFrames( stream, &framesAvail, &xrun ) );
        if( xrun )
        {
            assert( 0 == framesAvail );
            continue;

            /* XXX: Report xruns to the user? A situation is conceivable where the callback is never invoked due
             * to constant xruns, it might be desirable to notify the user of this.
             */
        }

        /* Consume buffer space. Once we have a number of frames available for consumption we must retrieve the
         * mmapped buffers from ALSA, this is contiguously accessible memory however, so we may receive smaller
         * portions at a time than is available as a whole. Therefore we should be prepared to process several
         * chunks successively. The buffers are passed to the PA buffer processor.
         */
        while( framesAvail > 0 )
        {
            xrun = 0;

            /** @concern Xruns Under/overflows are to be reported to the callback */
            if( stream->underrun > 0.0 )
            {
                cbFlags |= paOutputUnderflow;
                stream->underrun = 0.0;
            }
            if( stream->overrun > 0.0 )
            {
                cbFlags |= paInputOverflow;
                stream->overrun = 0.0;
            }
            if( stream->capture.pcm && stream->playback.pcm )
            {
                /** @concern FullDuplex It's possible that only one direction is being processed to avoid an
                 * under- or overflow, this should be reported correspondingly */
                if( !stream->capture.ready )
                {
                    cbFlags |= paInputUnderflow;
                    PA_DEBUG(( "%s: Input underflow\n", __FUNCTION__ ));
                }
                else if( !stream->playback.ready )
                {
                    cbFlags |= paOutputOverflow;
                    PA_DEBUG(( "%s: Output overflow\n", __FUNCTION__ ));
                }
            }

#if 0
            CallbackUpdate( &stream->threading );
#endif

            CalculateTimeInfo( stream, &timeInfo );
            PaUtil_BeginBufferProcessing( &stream->bufferProcessor, &timeInfo, cbFlags );
            cbFlags = 0;

            /* CPU load measurement should include processing activity external to the stream callback */
            PaUtil_BeginCpuLoadMeasurement( &stream->cpuLoadMeasurer );

            framesGot = framesAvail;
            if( paUtilFixedHostBufferSize == stream->bufferProcessor.hostBufferSizeMode )
            {
                /* We've committed to a fixed host buffer size, stick to that */
                framesGot = framesGot >= stream->maxFramesPerHostBuffer ? stream->maxFramesPerHostBuffer : 0;
            }
            else
            {
                /* We've committed to an upper bound on the size of host buffers */
                assert( paUtilBoundedHostBufferSize == stream->bufferProcessor.hostBufferSizeMode );
                framesGot = PA_MIN( framesGot, stream->maxFramesPerHostBuffer );
            }
            PA_ENSURE( PaAlsaStream_SetUpBuffers( stream, &framesGot, &xrun ) );
            /* Check the host buffer size against the buffer processor configuration */
            framesAvail -= framesGot;

            if( framesGot > 0 )
            {
                assert( !xrun );
                PaUtil_EndBufferProcessing( &stream->bufferProcessor, &callbackResult );
                PA_ENSURE( PaAlsaStream_EndProcessing( stream, framesGot, &xrun ) );
            }
            PaUtil_EndCpuLoadMeasurement( &stream->cpuLoadMeasurer, framesGot );

            if( 0 == framesGot )
            {
                /* Go back to polling for more frames */
                break;
            }

            if( paContinue != callbackResult )
                break;
        }
    }

end:
    ; /* Hack to fix "label at end of compound statement" error caused by pthread_cleanup_pop(1) macro. */
    /* Match pthread_cleanup_push */
    pthread_cleanup_pop( 1 );

    PA_DEBUG(( "%s: Thread %d exiting\n ", __FUNCTION__, pthread_self() ));
    PaUnixThreading_EXIT( result );

error:
    PA_DEBUG(( "%s: Thread %d is canceled due to error %d\n ", __FUNCTION__, pthread_self(), result ));
    goto end;
}